

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26dba::TestNotifiesReporterOfCheckFailureWithCorrectInfo::
~TestNotifiesReporterOfCheckFailureWithCorrectInfo
          (TestNotifiesReporterOfCheckFailureWithCorrectInfo *this)

{
  TestNotifiesReporterOfCheckFailureWithCorrectInfo *this_local;
  
  ~TestNotifiesReporterOfCheckFailureWithCorrectInfo(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(NotifiesReporterOfCheckFailureWithCorrectInfo)
{
    RecordingReporter reporter;
    TestResults results(&reporter);

    results.OnTestFailure(details, "failurestring");
    CHECK_EQUAL (1, reporter.testFailedCount);

    CHECK_EQUAL ("filename", reporter.lastFailedFile);
    CHECK_EQUAL (123, reporter.lastFailedLine);
    CHECK_EQUAL ("testname", reporter.lastFailedTest);
    CHECK_EQUAL ("suitename", reporter.lastFailedSuite);
    CHECK_EQUAL ("failurestring", reporter.lastFailedMessage);
}